

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O3

void dg::dda::MemorySSATransformation::performLvn(Definitions *D,RWBBlock *block)

{
  _List_node_base *p_Var1;
  
  for (p_Var1 = (block->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
                super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                _M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)
                &(block->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes;
      p_Var1 = p_Var1->_M_next) {
    Definitions::update(D,(RWNode *)p_Var1[1]._M_next,(RWNode *)0x0);
  }
  D->_processed = true;
  return;
}

Assistant:

void MemorySSATransformation::performLvn(Definitions &D, RWBBlock *block) {
    DBG_SECTION_BEGIN(dda, "Starting LVN for block " << block->getID());

    assert(!D.isProcessed() && "Processing a block multiple times");

    for (RWNode *node : block->getNodes()) {
        D.update(node);
    }

    D.setProcessed();
    DBG_SECTION_END(dda, "LVN of block " << block->getID() << " finished");
}